

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBlendTests.cpp
# Opt level: O3

int __thiscall deqp::gles2::Functional::BlendTests::init(BlendTests *this,EVP_PKEY_CTX *ctx)

{
  GLenum GVar1;
  GLenum GVar2;
  GLenum value;
  Context *pCVar3;
  _func_int **pp_Var4;
  TestNode *pTVar5;
  long *plVar6;
  BlendCase *pBVar7;
  TestNode *pTVar8;
  TestNode *node;
  undefined8 extraout_RAX;
  GLenum *pGVar9;
  undefined8 uVar10;
  uint uVar11;
  long *plVar12;
  ulong uVar13;
  char *__end;
  long lVar14;
  long lVar15;
  long lVar16;
  EnumGL *pEVar17;
  vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
  paramSets;
  string description;
  string name;
  undefined1 local_1b0 [16];
  undefined8 local_1a0;
  long lStack_198;
  float afStack_190 [2];
  undefined1 local_188 [24];
  long lStack_170;
  long *local_168;
  long local_160;
  long local_158;
  long lStack_150;
  long *local_148;
  long local_140;
  long local_138;
  long lStack_130;
  long *local_128;
  long local_120;
  long local_118;
  long lStack_110;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  TestNode *local_e8;
  EnumGL *local_e0;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  TestNode *local_98;
  TestNode *local_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68 [2];
  long local_58 [2];
  TestNode *local_48;
  TestNode *local_40;
  long local_38;
  
  pTVar5 = (TestNode *)operator_new(0x78);
  pCVar3 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,pCVar3->m_testCtx,"equation_src_func_dst_func",
             "Combinations of Blend Equations and Functions");
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_021296f0;
  pTVar5[1]._vptr_TestNode = (_func_int **)pCVar3;
  local_e8 = pTVar5;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  lVar16 = 0;
  local_98 = (TestNode *)this;
  do {
    lVar14 = 0;
    local_90 = (TestNode *)lVar16;
    do {
      lVar15 = 8;
      local_e0 = (EnumGL *)lVar14;
      do {
        GVar1 = *(GLenum *)((long)&init::blendEquations[2].nameStr + lVar15);
        if (GVar1 != 0x308) {
          local_128 = &local_118;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,0x1af8059,0x1af8059);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_128);
          local_148 = &local_138;
          plVar12 = plVar6 + 2;
          if ((long *)*plVar6 == plVar12) {
            local_138 = *plVar12;
            lStack_130 = plVar6[3];
          }
          else {
            local_138 = *plVar12;
            local_148 = (long *)*plVar6;
          }
          local_140 = plVar6[1];
          *plVar6 = (long)plVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_148);
          local_188._0_8_ = local_188 + 0x10;
          plVar12 = plVar6 + 2;
          if ((long *)*plVar6 == plVar12) {
            local_188._16_8_ = *plVar12;
            lStack_170 = plVar6[3];
          }
          else {
            local_188._16_8_ = *plVar12;
            local_188._0_8_ = (long *)*plVar6;
          }
          local_188._8_8_ = plVar6[1];
          *plVar6 = (long)plVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append(local_188);
          local_168 = &local_158;
          plVar12 = plVar6 + 2;
          if ((long *)*plVar6 == plVar12) {
            local_158 = *plVar12;
            lStack_150 = plVar6[3];
          }
          else {
            local_158 = *plVar12;
            local_168 = (long *)*plVar6;
          }
          local_160 = plVar6[1];
          *plVar6 = (long)plVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_168);
          local_1b0._0_8_ = &local_1a0;
          plVar12 = plVar6 + 2;
          if ((long *)*plVar6 == plVar12) {
            local_1a0 = (undefined1 *)*plVar12;
            lStack_198 = plVar6[3];
          }
          else {
            local_1a0 = (undefined1 *)*plVar12;
            local_1b0._0_8_ = (long *)*plVar6;
          }
          local_1b0._8_4_ = (undefined4)plVar6[1];
          local_1b0._12_4_ = (undefined4)((ulong)plVar6[1] >> 0x20);
          *plVar6 = (long)plVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append(local_1b0);
          local_108 = &local_f8;
          plVar12 = plVar6 + 2;
          if ((long *)*plVar6 == plVar12) {
            local_f8 = *plVar12;
            lStack_f0 = plVar6[3];
          }
          else {
            local_f8 = *plVar12;
            local_108 = (long *)*plVar6;
          }
          local_100 = plVar6[1];
          *plVar6 = (long)plVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((undefined8 *)local_1b0._0_8_ != &local_1a0) {
            operator_delete((void *)local_1b0._0_8_,(long)local_1a0 + 1);
          }
          if (local_168 != &local_158) {
            operator_delete(local_168,local_158 + 1);
          }
          if ((pointer)local_188._0_8_ != (pointer)(local_188 + 0x10)) {
            operator_delete((void *)local_188._0_8_,(ulong)((long)(GLenum *)local_188._16_8_ + 1));
          }
          if (local_148 != &local_138) {
            operator_delete(local_148,local_138 + 1);
          }
          if (local_128 != &local_118) {
            operator_delete(local_128,local_118 + 1);
          }
          local_b8 = &local_a8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,0x1af8059,0x1af8059);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_b8);
          local_d8 = &local_c8;
          plVar12 = plVar6 + 2;
          if ((long *)*plVar6 == plVar12) {
            local_c8 = *plVar12;
            lStack_c0 = plVar6[3];
          }
          else {
            local_c8 = *plVar12;
            local_d8 = (long *)*plVar6;
          }
          local_d0 = plVar6[1];
          *plVar6 = (long)plVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          GVar2 = init::blendEquations[lVar16].glValue;
          glu::getBlendEquationName(GVar2);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_d8);
          local_128 = &local_118;
          plVar12 = plVar6 + 2;
          if ((long *)*plVar6 == plVar12) {
            local_118 = *plVar12;
            lStack_110 = plVar6[3];
          }
          else {
            local_118 = *plVar12;
            local_128 = (long *)*plVar6;
          }
          local_120 = plVar6[1];
          *plVar6 = (long)plVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_128);
          local_148 = &local_138;
          plVar12 = plVar6 + 2;
          if ((long *)*plVar6 == plVar12) {
            local_138 = *plVar12;
            lStack_130 = plVar6[3];
          }
          else {
            local_138 = *plVar12;
            local_148 = (long *)*plVar6;
          }
          local_140 = plVar6[1];
          *plVar6 = (long)plVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          value = init::blendFunctions[lVar14].glValue;
          glu::getBlendFactorName(value);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_148);
          local_188._0_8_ = local_188 + 0x10;
          plVar12 = plVar6 + 2;
          if ((long *)*plVar6 == plVar12) {
            local_188._16_8_ = *plVar12;
            lStack_170 = plVar6[3];
          }
          else {
            local_188._16_8_ = *plVar12;
            local_188._0_8_ = (long *)*plVar6;
          }
          local_188._8_8_ = plVar6[1];
          *plVar6 = (long)plVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append(local_188);
          local_1b0._0_8_ = &local_1a0;
          plVar12 = plVar6 + 2;
          if ((long *)*plVar6 == plVar12) {
            local_1a0 = (undefined1 *)*plVar12;
            lStack_198 = plVar6[3];
          }
          else {
            local_1a0 = (undefined1 *)*plVar12;
            local_1b0._0_8_ = (long *)*plVar6;
          }
          local_1b0._8_4_ = (undefined4)plVar6[1];
          local_1b0._12_4_ = (undefined4)((ulong)plVar6[1] >> 0x20);
          *plVar6 = (long)plVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          glu::getBlendFactorName(GVar1);
          plVar6 = (long *)std::__cxx11::string::append(local_1b0);
          local_168 = &local_158;
          plVar12 = plVar6 + 2;
          if ((long *)*plVar6 == plVar12) {
            local_158 = *plVar12;
            lStack_150 = plVar6[3];
          }
          else {
            local_158 = *plVar12;
            local_168 = (long *)*plVar6;
          }
          local_160 = plVar6[1];
          *plVar6 = (long)plVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((undefined8 *)local_1b0._0_8_ != &local_1a0) {
            operator_delete((void *)local_1b0._0_8_,(long)local_1a0 + 1);
          }
          if ((pointer)local_188._0_8_ != (pointer)(local_188 + 0x10)) {
            operator_delete((void *)local_188._0_8_,(ulong)((long)(GLenum *)local_188._16_8_ + 1));
          }
          if (local_148 != &local_138) {
            operator_delete(local_148,local_138 + 1);
          }
          if (local_128 != &local_118) {
            operator_delete(local_128,local_118 + 1);
          }
          if (local_d8 != &local_c8) {
            operator_delete(local_d8,local_c8 + 1);
          }
          if (local_b8 != &local_a8) {
            operator_delete(local_b8,local_a8 + 1);
          }
          local_188._0_16_ = ZEXT816(0);
          local_188._16_8_ = (pointer)0x0;
          local_1a0 = (undefined1 *)CONCAT44(GVar1,value);
          lStack_198 = 0x3ecccccd3e4ccccd;
          afStack_190[0] = 0.6;
          afStack_190[1] = 0.8;
          local_1b0._0_4_ = GVar2;
          local_1b0._4_4_ = value;
          local_1b0._8_4_ = GVar1;
          local_1b0._12_4_ = GVar2;
          std::
          vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          ::emplace_back<deqp::gles2::Functional::BlendParams>
                    ((vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                      *)local_188,(BlendParams *)local_1b0);
          pBVar7 = (BlendCase *)operator_new(0x338);
          this = (BlendTests *)local_98;
          BlendCase::BlendCase
                    (pBVar7,(Context *)local_98[1]._vptr_TestNode,(char *)local_108,
                     (char *)local_168,
                     (vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                      *)local_188);
          tcu::TestNode::addChild(local_e8,(TestNode *)pBVar7);
          if ((pointer)local_188._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_188._0_8_,local_188._16_8_ - local_188._0_8_);
          }
          if (local_168 != &local_158) {
            operator_delete(local_168,local_158 + 1);
          }
          if (local_108 != &local_f8) {
            operator_delete(local_108,local_f8 + 1);
          }
        }
        lVar15 = lVar15 + 0x10;
      } while (lVar15 != 0xf8);
      lVar14 = (long)local_e0 + 1;
    } while (lVar14 != 0xf);
    lVar16 = (long)local_90 + 1;
  } while (lVar16 != 3);
  pTVar5 = (TestNode *)operator_new(0x78);
  pp_Var4 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,(TestContext *)*pp_Var4,"rgb_func_alpha_func",
             "Combinations of RGB and Alpha Functions");
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_021296f0;
  pTVar5[1]._vptr_TestNode = pp_Var4;
  tcu::TestNode::addChild((TestNode *)this,pTVar5);
  pTVar8 = (TestNode *)operator_new(0x78);
  pp_Var4 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,(TestContext *)*pp_Var4,"src","Source functions");
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_021296f0;
  pTVar8[1]._vptr_TestNode = pp_Var4;
  node = (TestNode *)operator_new(0x78);
  pp_Var4 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,(TestContext *)*pp_Var4,"dst","Destination functions");
  node->_vptr_TestNode = (_func_int **)&PTR__TestCase_021296f0;
  node[1]._vptr_TestNode = pp_Var4;
  tcu::TestNode::addChild(pTVar5,pTVar8);
  tcu::TestNode::addChild(pTVar5,node);
  uVar10 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  local_48 = node;
  local_40 = pTVar8;
  do {
    local_e8 = (TestNode *)CONCAT44(local_e8._4_4_,(int)uVar10);
    local_90 = local_48;
    if ((char)uVar10 != '\0') {
      local_90 = local_40;
    }
    lVar16 = 0;
    do {
      pEVar17 = init::blendFunctions + lVar16;
      lVar14 = 0;
      local_e0 = pEVar17;
      local_38 = lVar16;
      do {
        if ((((ulong)local_e8 & 1) != 0) ||
           ((pEVar17->glValue != 0x308 && (init::blendFunctions[lVar14].glValue != 0x308)))) {
          local_188._0_8_ = local_188 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_188,0x1af8059);
          plVar6 = (long *)std::__cxx11::string::append((char *)local_188);
          local_168 = &local_158;
          plVar12 = plVar6 + 2;
          if ((long *)*plVar6 == plVar12) {
            local_158 = *plVar12;
            lStack_150 = plVar6[3];
          }
          else {
            local_158 = *plVar12;
            local_168 = (long *)*plVar6;
          }
          local_160 = plVar6[1];
          *plVar6 = (long)plVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_168);
          local_1b0._0_8_ = &local_1a0;
          plVar12 = plVar6 + 2;
          if ((long *)*plVar6 == plVar12) {
            local_1a0 = (undefined1 *)*plVar12;
            lStack_198 = plVar6[3];
          }
          else {
            local_1a0 = (undefined1 *)*plVar12;
            local_1b0._0_8_ = (long *)*plVar6;
          }
          local_1b0._8_4_ = (undefined4)plVar6[1];
          local_1b0._12_4_ = (undefined4)((ulong)plVar6[1] >> 0x20);
          *plVar6 = (long)plVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append(local_1b0);
          local_108 = &local_f8;
          plVar12 = plVar6 + 2;
          if ((long *)*plVar6 == plVar12) {
            local_f8 = *plVar12;
            lStack_f0 = plVar6[3];
          }
          else {
            local_f8 = *plVar12;
            local_108 = (long *)*plVar6;
          }
          local_100 = plVar6[1];
          *plVar6 = (long)plVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((undefined8 *)local_1b0._0_8_ != &local_1a0) {
            operator_delete((void *)local_1b0._0_8_,(long)local_1a0 + 1);
          }
          if (local_168 != &local_158) {
            operator_delete(local_168,local_158 + 1);
          }
          if ((pointer)local_188._0_8_ != (pointer)(local_188 + 0x10)) {
            operator_delete((void *)local_188._0_8_,(ulong)((long)(GLenum *)local_188._16_8_ + 1));
          }
          local_68[0] = local_58;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_68,0x1af8059);
          plVar6 = (long *)std::__cxx11::string::append((char *)local_68);
          local_88 = &local_78;
          plVar12 = plVar6 + 2;
          if ((long *)*plVar6 == plVar12) {
            local_78 = *plVar12;
            lStack_70 = plVar6[3];
          }
          else {
            local_78 = *plVar12;
            local_88 = (long *)*plVar6;
          }
          local_80 = plVar6[1];
          *plVar6 = (long)plVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_88);
          local_b8 = &local_a8;
          plVar12 = plVar6 + 2;
          if ((long *)*plVar6 == plVar12) {
            local_a8 = *plVar12;
            lStack_a0 = plVar6[3];
          }
          else {
            local_a8 = *plVar12;
            local_b8 = (long *)*plVar6;
          }
          local_b0 = plVar6[1];
          *plVar6 = (long)plVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_b8);
          local_d8 = &local_c8;
          plVar12 = plVar6 + 2;
          if ((long *)*plVar6 == plVar12) {
            local_c8 = *plVar12;
            lStack_c0 = plVar6[3];
          }
          else {
            local_c8 = *plVar12;
            local_d8 = (long *)*plVar6;
          }
          local_d0 = plVar6[1];
          *plVar6 = (long)plVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          GVar1 = pEVar17->glValue;
          glu::getBlendFactorName(GVar1);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_d8);
          local_128 = &local_118;
          plVar12 = plVar6 + 2;
          if ((long *)*plVar6 == plVar12) {
            local_118 = *plVar12;
            lStack_110 = plVar6[3];
          }
          else {
            local_118 = *plVar12;
            local_128 = (long *)*plVar6;
          }
          local_120 = plVar6[1];
          *plVar6 = (long)plVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_128);
          local_148 = &local_138;
          plVar12 = plVar6 + 2;
          if ((long *)*plVar6 == plVar12) {
            local_138 = *plVar12;
            lStack_130 = plVar6[3];
          }
          else {
            local_138 = *plVar12;
            local_148 = (long *)*plVar6;
          }
          local_140 = plVar6[1];
          *plVar6 = (long)plVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_148);
          local_188._0_8_ = local_188 + 0x10;
          plVar12 = plVar6 + 2;
          if ((long *)*plVar6 == plVar12) {
            local_188._16_8_ = *plVar12;
            lStack_170 = plVar6[3];
          }
          else {
            local_188._16_8_ = *plVar12;
            local_188._0_8_ = (long *)*plVar6;
          }
          local_188._8_8_ = plVar6[1];
          *plVar6 = (long)plVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          plVar6 = (long *)std::__cxx11::string::append(local_188);
          local_1b0._0_8_ = &local_1a0;
          plVar12 = plVar6 + 2;
          if ((long *)*plVar6 == plVar12) {
            local_1a0 = (undefined1 *)*plVar12;
            lStack_198 = plVar6[3];
          }
          else {
            local_1a0 = (undefined1 *)*plVar12;
            local_1b0._0_8_ = (long *)*plVar6;
          }
          local_1b0._8_4_ = (undefined4)plVar6[1];
          local_1b0._12_4_ = (undefined4)((ulong)plVar6[1] >> 0x20);
          *plVar6 = (long)plVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          uVar11 = init::blendFunctions[lVar14].glValue;
          glu::getBlendFactorName(uVar11);
          plVar6 = (long *)std::__cxx11::string::append(local_1b0);
          local_168 = &local_158;
          plVar12 = plVar6 + 2;
          if ((long *)*plVar6 == plVar12) {
            local_158 = *plVar12;
            lStack_150 = plVar6[3];
          }
          else {
            local_158 = *plVar12;
            local_168 = (long *)*plVar6;
          }
          local_160 = plVar6[1];
          *plVar6 = (long)plVar12;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          if ((undefined8 *)local_1b0._0_8_ != &local_1a0) {
            operator_delete((void *)local_1b0._0_8_,(long)local_1a0 + 1);
          }
          if ((pointer)local_188._0_8_ != (pointer)(local_188 + 0x10)) {
            operator_delete((void *)local_188._0_8_,(ulong)((long)(GLenum *)local_188._16_8_ + 1));
          }
          if (local_148 != &local_138) {
            operator_delete(local_148,local_138 + 1);
          }
          if (local_128 != &local_118) {
            operator_delete(local_128,local_118 + 1);
          }
          if (local_d8 != &local_c8) {
            operator_delete(local_d8,local_c8 + 1);
          }
          if (local_b8 != &local_a8) {
            operator_delete(local_b8,local_a8 + 1);
          }
          if (local_88 != &local_78) {
            operator_delete(local_88,local_78 + 1);
          }
          if (local_68[0] != local_58) {
            operator_delete(local_68[0],local_58[0] + 1);
          }
          local_188._0_16_ = (undefined1  [16])0x0;
          local_188._16_8_ = (pointer)0x0;
          local_1b0._0_4_ = 0x8006;
          local_1b0._8_4_ = 1;
          local_1b0._12_4_ = 0x8006;
          local_1a0._4_4_ = 1;
          local_1a0._0_4_ = uVar11;
          lStack_198._0_4_ = 0.2;
          lStack_198._4_4_ = 0.4;
          afStack_190[0] = 0.6;
          afStack_190[1] = 0.8;
          local_1b0._4_4_ = GVar1;
          std::
          vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          ::emplace_back<deqp::gles2::Functional::BlendParams>
                    ((vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                      *)local_188,(BlendParams *)local_1b0);
          local_1b0._0_4_ = 0x8006;
          local_1b0._8_4_ = 0;
          local_1b0._12_4_ = 0x8006;
          local_1a0 = (undefined1 *)(ulong)uVar11;
          lStack_198._0_4_ = 0.2;
          lStack_198._4_4_ = 0.4;
          afStack_190[0] = 0.6;
          afStack_190[1] = 0.8;
          local_1b0._4_4_ = GVar1;
          std::
          vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          ::emplace_back<deqp::gles2::Functional::BlendParams>
                    ((vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                      *)local_188,(BlendParams *)local_1b0);
          local_1b0._0_4_ = 0x8006;
          local_1b0._8_4_ = 0x300;
          local_1b0._12_4_ = 0x8006;
          local_1a0._4_4_ = 0x300;
          lStack_198._0_4_ = 0.2;
          lStack_198._4_4_ = 0.4;
          afStack_190[0] = 0.6;
          afStack_190[1] = 0.8;
          local_1b0._4_4_ = GVar1;
          std::
          vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          ::emplace_back<deqp::gles2::Functional::BlendParams>
                    ((vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                      *)local_188,(BlendParams *)local_1b0);
          local_1b0._0_4_ = 0x8006;
          local_1b0._8_4_ = 0x306;
          local_1b0._12_4_ = 0x8006;
          local_1a0 = (undefined1 *)CONCAT44(0x306,uVar11);
          lStack_198 = 0x3ecccccd3e4ccccd;
          afStack_190[0] = 0.6;
          afStack_190[1] = 0.8;
          local_1b0._4_4_ = GVar1;
          std::
          vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          ::emplace_back<deqp::gles2::Functional::BlendParams>
                    ((vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                      *)local_188,(BlendParams *)local_1b0);
          if (((ulong)local_e8 & 1) == 0) {
            uVar11 = (int)((long)(local_188._8_8_ - local_188._0_8_) >> 3) * -0x33333333;
            if (0 < (int)uVar11) {
              uVar13 = (ulong)(uVar11 & 0x7fffffff);
              pGVar9 = (GLenum *)(local_188._0_8_ + 0x10);
              do {
                *(ulong *)(pGVar9 + -3) =
                     CONCAT44((int)*(undefined8 *)(pGVar9 + -3),
                              (int)((ulong)*(undefined8 *)(pGVar9 + -3) >> 0x20));
                *(ulong *)pGVar9 =
                     CONCAT44((int)*(undefined8 *)pGVar9,(int)((ulong)*(undefined8 *)pGVar9 >> 0x20)
                             );
                pGVar9 = pGVar9 + 10;
                uVar13 = uVar13 - 1;
              } while (uVar13 != 0);
            }
          }
          pBVar7 = (BlendCase *)operator_new(0x338);
          pEVar17 = local_e0;
          BlendCase::BlendCase
                    (pBVar7,(Context *)local_98[1]._vptr_TestNode,(char *)local_108,
                     (char *)local_168,
                     (vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                      *)local_188);
          tcu::TestNode::addChild(local_90,(TestNode *)pBVar7);
          if ((pointer)local_188._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_188._0_8_,local_188._16_8_ - local_188._0_8_);
          }
          if (local_168 != &local_158) {
            operator_delete(local_168,local_158 + 1);
          }
          if (local_108 != &local_f8) {
            operator_delete(local_108,local_f8 + 1);
          }
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0xf);
      lVar16 = local_38 + 1;
    } while (lVar16 != 0xf);
    uVar10 = 0;
  } while (((ulong)local_e8 & 1) != 0);
  pTVar8 = (TestNode *)operator_new(0x78);
  pTVar5 = local_98;
  pp_Var4 = local_98[1]._vptr_TestNode;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar8,(TestContext *)*pp_Var4,"rgb_equation_alpha_equation",
             "Combinations of RGB and Alpha Equation Combinations");
  pTVar8->_vptr_TestNode = (_func_int **)&PTR__TestCase_021296f0;
  pTVar8[1]._vptr_TestNode = pp_Var4;
  tcu::TestNode::addChild(pTVar5,pTVar8);
  local_e0 = (EnumGL *)0x0;
  local_e8 = pTVar8;
  do {
    pEVar17 = init::blendEquations + (long)local_e0;
    lVar16 = 8;
    do {
      local_188._0_8_ = local_188 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_188,0x1af8059,0x1af8059);
      plVar6 = (long *)std::__cxx11::string::append((char *)local_188);
      local_168 = &local_158;
      plVar12 = plVar6 + 2;
      if ((long *)*plVar6 == plVar12) {
        local_158 = *plVar12;
        lStack_150 = plVar6[3];
      }
      else {
        local_158 = *plVar12;
        local_168 = (long *)*plVar6;
      }
      local_160 = plVar6[1];
      *plVar6 = (long)plVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_168);
      local_1b0._0_8_ = &local_1a0;
      plVar12 = plVar6 + 2;
      if ((long *)*plVar6 == plVar12) {
        local_1a0 = (undefined1 *)*plVar12;
        lStack_198 = plVar6[3];
      }
      else {
        local_1a0 = (undefined1 *)*plVar12;
        local_1b0._0_8_ = (long *)*plVar6;
      }
      local_1b0._8_4_ = (undefined4)plVar6[1];
      local_1b0._12_4_ = (undefined4)((ulong)plVar6[1] >> 0x20);
      *plVar6 = (long)plVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append(local_1b0);
      local_108 = &local_f8;
      plVar12 = plVar6 + 2;
      if ((long *)*plVar6 == plVar12) {
        local_f8 = *plVar12;
        lStack_f0 = plVar6[3];
      }
      else {
        local_f8 = *plVar12;
        local_108 = (long *)*plVar6;
      }
      local_100 = plVar6[1];
      *plVar6 = (long)plVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((undefined8 *)local_1b0._0_8_ != &local_1a0) {
        operator_delete((void *)local_1b0._0_8_,(long)local_1a0 + 1);
      }
      if (local_168 != &local_158) {
        operator_delete(local_168,local_158 + 1);
      }
      if ((pointer)local_188._0_8_ != (pointer)(local_188 + 0x10)) {
        operator_delete((void *)local_188._0_8_,(ulong)((long)(GLenum *)local_188._16_8_ + 1));
      }
      local_128 = &local_118;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,0x1af8059,0x1af8059);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_128);
      local_148 = &local_138;
      plVar12 = plVar6 + 2;
      if ((long *)*plVar6 == plVar12) {
        local_138 = *plVar12;
        lStack_130 = plVar6[3];
      }
      else {
        local_138 = *plVar12;
        local_148 = (long *)*plVar6;
      }
      local_140 = plVar6[1];
      *plVar6 = (long)plVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      GVar1 = pEVar17->glValue;
      glu::getBlendEquationName(GVar1);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_148);
      local_188._0_8_ = local_188 + 0x10;
      plVar12 = plVar6 + 2;
      if ((long *)*plVar6 == plVar12) {
        local_188._16_8_ = *plVar12;
        lStack_170 = plVar6[3];
      }
      else {
        local_188._16_8_ = *plVar12;
        local_188._0_8_ = (long *)*plVar6;
      }
      local_188._8_8_ = plVar6[1];
      *plVar6 = (long)plVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)local_188);
      local_1b0._0_8_ = &local_1a0;
      plVar12 = plVar6 + 2;
      if ((long *)*plVar6 == plVar12) {
        local_1a0 = (undefined1 *)*plVar12;
        lStack_198 = plVar6[3];
      }
      else {
        local_1a0 = (undefined1 *)*plVar12;
        local_1b0._0_8_ = (long *)*plVar6;
      }
      local_1b0._8_4_ = (undefined4)plVar6[1];
      local_1b0._12_4_ = (undefined4)((ulong)plVar6[1] >> 0x20);
      *plVar6 = (long)plVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      GVar2 = *(GLenum *)((long)&PTR_iterate_0212d938 + lVar16);
      glu::getBlendEquationName(GVar2);
      plVar6 = (long *)std::__cxx11::string::append(local_1b0);
      local_168 = &local_158;
      plVar12 = plVar6 + 2;
      if ((long *)*plVar6 == plVar12) {
        local_158 = *plVar12;
        lStack_150 = plVar6[3];
      }
      else {
        local_158 = *plVar12;
        local_168 = (long *)*plVar6;
      }
      local_160 = plVar6[1];
      *plVar6 = (long)plVar12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((undefined8 *)local_1b0._0_8_ != &local_1a0) {
        operator_delete((void *)local_1b0._0_8_,(long)local_1a0 + 1);
      }
      if ((pointer)local_188._0_8_ != (pointer)(local_188 + 0x10)) {
        operator_delete((void *)local_188._0_8_,(ulong)((long)(GLenum *)local_188._16_8_ + 1));
      }
      if (local_148 != &local_138) {
        operator_delete(local_148,local_138 + 1);
      }
      if (local_128 != &local_118) {
        operator_delete(local_128,local_118 + 1);
      }
      local_188._0_16_ = (undefined1  [16])0x0;
      local_188._16_8_ = (pointer)0x0;
      local_1b0._4_4_ = 1;
      local_1b0._8_4_ = 1;
      local_1a0 = &DAT_100000001;
      lStack_198 = 0x3ecccccd3e4ccccd;
      afStack_190[0] = 0.6;
      afStack_190[1] = 0.8;
      local_1b0._0_4_ = GVar1;
      local_1b0._12_4_ = GVar2;
      std::
      vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
      ::emplace_back<deqp::gles2::Functional::BlendParams>
                ((vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                  *)local_188,(BlendParams *)local_1b0);
      pBVar7 = (BlendCase *)operator_new(0x338);
      pTVar5 = local_e8;
      BlendCase::BlendCase
                (pBVar7,(Context *)local_98[1]._vptr_TestNode,(char *)local_108,(char *)local_168,
                 (vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                  *)local_188);
      tcu::TestNode::addChild(pTVar5,(TestNode *)pBVar7);
      if ((pointer)local_188._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_188._0_8_,local_188._16_8_ - local_188._0_8_);
      }
      if (local_168 != &local_158) {
        operator_delete(local_168,local_158 + 1);
      }
      if (local_108 != &local_f8) {
        operator_delete(local_108,local_f8 + 1);
      }
      lVar16 = lVar16 + 0x10;
    } while (lVar16 != 0x38);
    local_e0 = (EnumGL *)((long)local_e0 + 1);
  } while (local_e0 != (EnumGL *)0x3);
  return 3;
}

Assistant:

void BlendTests::init (void)
{
	struct EnumGL
	{
		GLenum			glValue;
		const char*		nameStr;
	};

	static const EnumGL blendEquations[] =
	{
		{ GL_FUNC_ADD,					"add"					},
		{ GL_FUNC_SUBTRACT,				"subtract"				},
		{ GL_FUNC_REVERSE_SUBTRACT,		"reverse_subtract"		}
	};

	static const EnumGL blendFunctions[] =
	{
		{ GL_ZERO,							"zero"						},
		{ GL_ONE,							"one"						},
		{ GL_SRC_COLOR,						"src_color"					},
		{ GL_ONE_MINUS_SRC_COLOR,			"one_minus_src_color"		},
		{ GL_DST_COLOR,						"dst_color"					},
		{ GL_ONE_MINUS_DST_COLOR,			"one_minus_dst_color"		},
		{ GL_SRC_ALPHA,						"src_alpha"					},
		{ GL_ONE_MINUS_SRC_ALPHA,			"one_minus_src_alpha"		},
		{ GL_DST_ALPHA,						"dst_alpha"					},
		{ GL_ONE_MINUS_DST_ALPHA,			"one_minus_dst_alpha"		},
		{ GL_CONSTANT_COLOR,				"constant_color"			},
		{ GL_ONE_MINUS_CONSTANT_COLOR,		"one_minus_constant_color"	},
		{ GL_CONSTANT_ALPHA,				"constant_alpha"			},
		{ GL_ONE_MINUS_CONSTANT_ALPHA,		"one_minus_constant_alpha"	},
		{ GL_SRC_ALPHA_SATURATE,			"src_alpha_saturate"		}
	};

	const Vec4 defaultBlendColor(0.2f, 0.4f, 0.6f, 0.8f);

	// Test all blend equation, src blend function, dst blend function combinations. RGB and alpha modes are the same.

	{
		TestCaseGroup* group = new TestCaseGroup(m_context, "equation_src_func_dst_func", "Combinations of Blend Equations and Functions");
		addChild(group);

		for (int equationNdx = 0;	equationNdx < DE_LENGTH_OF_ARRAY(blendEquations);	equationNdx++)
		for (int srcFuncNdx = 0;	srcFuncNdx < DE_LENGTH_OF_ARRAY(blendFunctions);	srcFuncNdx++)
		for (int dstFuncNdx = 0;	dstFuncNdx < DE_LENGTH_OF_ARRAY(blendFunctions);	dstFuncNdx++)
		{
			const EnumGL& eq	= blendEquations[equationNdx];
			const EnumGL& src	= blendFunctions[srcFuncNdx];
			const EnumGL& dst	= blendFunctions[dstFuncNdx];

			if (dst.glValue == GL_SRC_ALPHA_SATURATE) // SRC_ALPHA_SATURATE is only valid for src func.
				continue;

			string name			= string("") + eq.nameStr + "_" + src.nameStr + "_" + dst.nameStr;
			string description	= string("") +
								  "Equations "		+ getBlendEquationName(eq.glValue) +
								  ", src funcs "	+ getBlendFactorName(src.glValue) +
								  ", dst funcs "	+ getBlendFactorName(dst.glValue);

			vector<BlendParams> paramSets;
			paramSets.push_back(BlendParams(eq.glValue, src.glValue, dst.glValue, eq.glValue, src.glValue, dst.glValue, defaultBlendColor));

			group->addChild(new BlendCase(m_context, name.c_str(), description.c_str(), paramSets));
		}
	}

	// Test all RGB src, alpha src and RGB dst, alpha dst combinations. Equations are ADD.
	// \note For all RGB src, alpha src combinations, also test a couple of different RGBA dst functions, and vice versa.

	{
		TestCaseGroup* mainGroup = new TestCaseGroup(m_context, "rgb_func_alpha_func", "Combinations of RGB and Alpha Functions");
		addChild(mainGroup);
		TestCaseGroup* srcGroup = new TestCaseGroup(m_context, "src", "Source functions");
		TestCaseGroup* dstGroup = new TestCaseGroup(m_context, "dst", "Destination functions");
		mainGroup->addChild(srcGroup);
		mainGroup->addChild(dstGroup);

		for (int isDstI = 0;		isDstI <= 1;										isDstI++)
		for (int rgbFuncNdx = 0;	rgbFuncNdx < DE_LENGTH_OF_ARRAY(blendFunctions);	rgbFuncNdx++)
		for (int alphaFuncNdx = 0;	alphaFuncNdx < DE_LENGTH_OF_ARRAY(blendFunctions);	alphaFuncNdx++)
		{
			bool			isSrc			= isDstI == 0;
			TestCaseGroup*	curGroup		= isSrc ? srcGroup : dstGroup;
			const EnumGL&	funcRGB			= blendFunctions[rgbFuncNdx];
			const EnumGL&	funcAlpha		= blendFunctions[alphaFuncNdx];
			const char*		dstOrSrcStr		= isSrc ? "src" : "dst";

			if (!isSrc && (funcRGB.glValue == GL_SRC_ALPHA_SATURATE || funcAlpha.glValue == GL_SRC_ALPHA_SATURATE)) // SRC_ALPHA_SATURATE is only valid for src func.
				continue;

			string name			= string("") + funcRGB.nameStr + "_" + funcAlpha.nameStr;
			string description	= string("") +
								  "RGB "		+ dstOrSrcStr + " func " + getBlendFactorName(funcRGB.glValue) +
								  ", alpha "	+ dstOrSrcStr + " func " + getBlendFactorName(funcAlpha.glValue);

			// First, make param sets as if this was a src case.

			vector<BlendParams> paramSets;
			paramSets.push_back(BlendParams(GL_FUNC_ADD, funcRGB.glValue, GL_ONE,			GL_FUNC_ADD, funcAlpha.glValue, GL_ONE,			defaultBlendColor));
			paramSets.push_back(BlendParams(GL_FUNC_ADD, funcRGB.glValue, GL_ZERO,			GL_FUNC_ADD, funcAlpha.glValue, GL_ZERO,		defaultBlendColor));
			paramSets.push_back(BlendParams(GL_FUNC_ADD, funcRGB.glValue, GL_SRC_COLOR,		GL_FUNC_ADD, funcAlpha.glValue, GL_SRC_COLOR,	defaultBlendColor));
			paramSets.push_back(BlendParams(GL_FUNC_ADD, funcRGB.glValue, GL_DST_COLOR,		GL_FUNC_ADD, funcAlpha.glValue, GL_DST_COLOR,	defaultBlendColor));

			// Swap src and dst params if this is a dst case.

			if (!isSrc)
			{
				for (int i = 0; i < (int)paramSets.size(); i++)
				{
					std::swap(paramSets[i].srcFuncRGB,		paramSets[i].dstFuncRGB);
					std::swap(paramSets[i].srcFuncAlpha,	paramSets[i].dstFuncAlpha);
				}
			}

			curGroup->addChild(new BlendCase(m_context, name.c_str(), description.c_str(), paramSets));
		}
	}

	// Test all RGB and alpha equation combinations. Src and dst funcs are ONE for both.

	{
		TestCaseGroup* group = new TestCaseGroup(m_context, "rgb_equation_alpha_equation", "Combinations of RGB and Alpha Equation Combinations");
		addChild(group);

		for (int equationRGBNdx = 0;	equationRGBNdx < DE_LENGTH_OF_ARRAY(blendEquations);	equationRGBNdx++)
		for (int equationAlphaNdx = 0;	equationAlphaNdx < DE_LENGTH_OF_ARRAY(blendEquations);	equationAlphaNdx++)
		{
			const EnumGL& eqRGB			= blendEquations[equationRGBNdx];
			const EnumGL& eqAlpha		= blendEquations[equationAlphaNdx];

			string name			= string("") + eqRGB.nameStr + "_" + eqAlpha.nameStr;
			string description	= string("") +
								  "RGB equation "		+ getBlendEquationName(eqRGB.glValue) +
								  ", alpha equation "	+ getBlendEquationName(eqAlpha.glValue);

			vector<BlendParams> paramSets;
			paramSets.push_back(BlendParams(eqRGB.glValue, GL_ONE, GL_ONE, eqAlpha.glValue, GL_ONE, GL_ONE, defaultBlendColor));

			group->addChild(new BlendCase(m_context, name.c_str(), description.c_str(), paramSets));
		}
	}
}